

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

bufsize_t __thiscall
SectionHdrWrapper::getContentSize(SectionHdrWrapper *this,addr_type aType,bool recalculate)

{
  SectionHdrWrapper *local_28;
  bufsize_t size;
  bool recalculate_local;
  addr_type aType_local;
  SectionHdrWrapper *this_local;
  
  if ((this->header == (IMAGE_SECTION_HEADER *)0x0) ||
     ((this->super_PENodeWrapper).m_PE == (PEFile *)0x0)) {
    this_local = (SectionHdrWrapper *)0x0;
  }
  else {
    local_28 = (SectionHdrWrapper *)0x0;
    if (recalculate) {
      if (aType == RAW) {
        local_28 = (SectionHdrWrapper *)getMappedRawSize(this);
      }
      if ((aType == RVA) || (aType == VA)) {
        local_28 = (SectionHdrWrapper *)getMappedVirtualSize(this);
      }
      this_local = local_28;
    }
    else {
      this_local = (SectionHdrWrapper *)getContentDeclaredSize(this,aType);
    }
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t SectionHdrWrapper::getContentSize(Executable::addr_type aType, bool recalculate)
{
    if (!this->header || !m_PE) return 0;

    bufsize_t size = 0;
    if (!recalculate) {
        size = getContentDeclaredSize(aType);
        //printf("Declared size = %llx\n---\n", size);
        return size;
    }
    //---
    if (aType == Executable::RAW) {
        //printf ("R: ");
        size = getMappedRawSize();
    }
    if (aType == Executable::RVA || aType == Executable::VA) {
        size = getMappedVirtualSize();
        //printf ("V: ");
    }
    //printf("Mapped size = %llx\n", size);
    return size;
}